

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ptls_key_exchange_context_t **pppVar6;
  long lVar7;
  anon_struct_72_2_510fbff9 *paVar8;
  ptls_cipher_suite_t *ppVar9;
  ptls_hash_context_t *ppVar10;
  size_t sVar11;
  anon_struct_72_2_510fbff9 *paVar12;
  anon_struct_72_2_510fbff9 *paVar13;
  int iVar14;
  size_t __size;
  char cVar15;
  long lVar16;
  ulong uVar17;
  anon_struct_72_2_510fbff9 *paVar18;
  ulong uVar19;
  anon_struct_72_2_510fbff9 *paVar20;
  ptls_key_exchange_context_t *ppVar21;
  uint16_t uVar22;
  ulong in_R10;
  bool bVar23;
  anon_struct_72_2_510fbff9 *local_58;
  int local_4c;
  anon_struct_72_2_510fbff9 *local_48;
  anon_struct_72_2_510fbff9 *local_40;
  long local_38;
  
  sVar11 = esni_keys.len;
  paVar12 = (anon_struct_72_2_510fbff9 *)esni_keys.base;
  __size = 0;
  do {
    plVar1 = (long *)((long)key_exchanges + __size);
    __size = __size + 8;
  } while (*plVar1 != 0);
  esni->not_after = 0;
  *(undefined8 *)&esni->version = 0;
  *(undefined8 *)&esni->padded_length = 0;
  esni->not_before = 0;
  esni->key_exchanges = (ptls_key_exchange_context_t **)0x0;
  esni->cipher_suites = (anon_struct_72_2_510fbff9 *)0x0;
  local_58 = paVar12;
  pppVar6 = (ptls_key_exchange_context_t **)malloc(__size);
  esni->key_exchanges = pppVar6;
  if (pppVar6 == (ptls_key_exchange_context_t **)0x0) {
    iVar5 = 0x201;
  }
  else {
    memcpy(pppVar6,key_exchanges,__size);
    iVar5 = 0x32;
    if (1 < (long)sVar11) {
      esni->version =
           *(ushort *)&paVar12->cipher_suite << 8 | *(ushort *)&paVar12->cipher_suite >> 8;
      local_58 = (anon_struct_72_2_510fbff9 *)((long)&paVar12->cipher_suite + 2);
      paVar13 = (anon_struct_72_2_510fbff9 *)(paVar12->record_digest + (sVar11 - 8));
      iVar5 = 0x33;
      if (3 < (long)paVar13 - (long)local_58) {
        local_58 = (anon_struct_72_2_510fbff9 *)((long)&paVar12->cipher_suite + 6);
        iVar5 = 0x32;
        iVar4 = 5;
        if (1 < (ulong)((long)paVar13 - (long)local_58)) {
          lVar16 = 0;
          uVar19 = 0;
          do {
            uVar19 = (ulong)local_58->record_digest[lVar16 + -8] | uVar19 << 8;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 2);
          local_58 = (anon_struct_72_2_510fbff9 *)paVar12->record_digest;
          if (uVar19 <= (ulong)((long)paVar13 - (long)local_58)) {
            local_58 = (anon_struct_72_2_510fbff9 *)((long)local_58 + uVar19);
            iVar4 = 0;
            iVar5 = 0;
          }
        }
        if (iVar4 != 5) {
          if (iVar4 != 0) {
            return iVar5;
          }
          iVar5 = 0x32;
          iVar4 = 5;
          if (1 < (ulong)((long)paVar13 - (long)local_58)) {
            lVar16 = 0;
            uVar19 = 0;
            do {
              uVar17 = uVar19 << 8;
              uVar19 = local_58->record_digest[lVar16 + -8] | uVar17;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 2);
            local_58 = (anon_struct_72_2_510fbff9 *)((long)&local_58->cipher_suite + 2);
            if (uVar19 <= (ulong)((long)paVar13 - (long)local_58)) {
              paVar18 = (anon_struct_72_2_510fbff9 *)(local_58->record_digest + (uVar19 - 8));
              do {
                lVar16 = (long)paVar18 - (long)local_58;
                iVar5 = 0x32;
                if (1 < lVar16) {
                  uVar17 = (ulong)(ushort)(*(ushort *)&local_58->cipher_suite << 8 |
                                          *(ushort *)&local_58->cipher_suite >> 8);
                  local_58 = (anon_struct_72_2_510fbff9 *)((long)&local_58->cipher_suite + 2);
                  iVar5 = 0;
                }
                iVar4 = 5;
                if (1 < lVar16) {
                  iVar5 = 0x32;
                  if ((ulong)((long)paVar18 - (long)local_58) < 2) {
                    bVar2 = false;
                  }
                  else {
                    lVar16 = 0;
                    uVar19 = 0;
                    do {
                      uVar19 = (ulong)local_58->record_digest[lVar16 + -8] | uVar19 << 8;
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 2);
                    local_58 = (anon_struct_72_2_510fbff9 *)((long)&local_58->cipher_suite + 2);
                    in_R10 = (long)paVar18 - (long)local_58;
                    bVar2 = false;
                    if (uVar19 <= in_R10) {
                      local_58 = (anon_struct_72_2_510fbff9 *)
                                 (local_58->record_digest + (uVar19 - 8));
                      bVar2 = true;
                      iVar4 = 0;
                      iVar5 = 0;
                    }
                  }
                  if (bVar2) {
                    ppVar21 = *key_exchanges;
                    pppVar6 = key_exchanges + 1;
                    while ((iVar4 = 0, ppVar21 != (ptls_key_exchange_context_t *)0x0 &&
                           (iVar4 = 0, ppVar21->algo->id != (uint16_t)uVar17))) {
                      ppVar21 = *pppVar6;
                      pppVar6 = pppVar6 + 1;
                    }
                  }
                }
                if (iVar4 != 0) goto LAB_00110871;
              } while (local_58 != paVar18);
              iVar4 = 0;
            }
          }
LAB_00110871:
          if (iVar4 != 5) {
            if (iVar4 != 0) {
              return iVar5;
            }
            iVar5 = 0x32;
            cVar3 = '\x05';
            if (1 < (ulong)((long)paVar13 - (long)local_58)) {
              lVar16 = 0;
              uVar19 = 0;
              do {
                uVar19 = (ulong)local_58->record_digest[lVar16 + -8] | uVar19 << 8;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 2);
              paVar18 = (anon_struct_72_2_510fbff9 *)((long)&local_58->cipher_suite + 2);
              local_58 = paVar18;
              if (uVar19 <= (ulong)((long)paVar13 - (long)paVar18)) {
                paVar20 = (anon_struct_72_2_510fbff9 *)(paVar18->record_digest + (uVar19 - 8));
                lVar16 = 0;
                local_40 = paVar13;
                do {
                  lVar7 = (long)paVar20 - (long)paVar18;
                  iVar4 = 0x32;
                  if (1 < lVar7) {
                    in_R10 = (ulong)(ushort)(*(ushort *)&paVar18->cipher_suite << 8 |
                                            *(ushort *)&paVar18->cipher_suite >> 8);
                    paVar18 = (anon_struct_72_2_510fbff9 *)((long)&paVar18->cipher_suite + 2);
                    iVar4 = 0;
                  }
                  cVar15 = '\x05';
                  if (lVar7 < 2) {
                    bVar2 = false;
                  }
                  else {
                    ppVar9 = *ctx->cipher_suites;
                    bVar2 = true;
                    bVar23 = ppVar9 == (ptls_cipher_suite_t *)0x0;
                    if (!bVar23) {
                      uVar22 = (uint16_t)in_R10;
                      if (ppVar9->id == uVar22) {
                        lVar7 = 0;
                      }
                      else {
                        lVar7 = 0;
                        do {
                          ppVar9 = ctx->cipher_suites[lVar7 + 1];
                          bVar23 = ppVar9 == (ptls_cipher_suite_t *)0x0;
                          if (bVar23) goto LAB_00110951;
                          lVar7 = lVar7 + 1;
                        } while (ppVar9->id != uVar22);
                      }
                      if (!bVar23) {
                        local_4c = CONCAT22(local_4c._2_2_,uVar22);
                        local_48 = paVar18;
                        local_38 = lVar16;
                        paVar8 = (anon_struct_72_2_510fbff9 *)
                                 realloc(esni->cipher_suites,(lVar16 * 8 + 8) * 9);
                        iVar4 = 0;
                        paVar13 = local_40;
                        paVar18 = local_48;
                        if (paVar8 == (anon_struct_72_2_510fbff9 *)0x0) {
                          iVar4 = 0x201;
                          bVar2 = false;
                          in_R10 = (ulong)(ushort)local_4c;
                          cVar15 = '\x05';
                          lVar16 = local_38;
                        }
                        else {
                          esni->cipher_suites = paVar8;
                          paVar8[local_38].cipher_suite = ctx->cipher_suites[lVar7];
                          cVar15 = '\0';
                          in_R10 = (ulong)(ushort)local_4c;
                          bVar2 = true;
                          lVar16 = local_38 + 1;
                        }
                        goto LAB_00110953;
                      }
                    }
LAB_00110951:
                    cVar15 = '\0';
                    iVar4 = 0;
                  }
LAB_00110953:
                  if (!bVar2) goto LAB_00110a62;
                } while (paVar18 != paVar20);
                local_48 = (anon_struct_72_2_510fbff9 *)CONCAT44(local_48._4_4_,iVar4);
                local_58 = paVar18;
                paVar8 = (anon_struct_72_2_510fbff9 *)
                         realloc(esni->cipher_suites,lVar16 * 0x48 + 0x48);
                paVar18 = local_58;
                if (paVar8 == (anon_struct_72_2_510fbff9 *)0x0) {
                  iVar4 = 0x201;
                  cVar15 = '\x05';
                }
                else {
                  esni->cipher_suites = paVar8;
                  paVar8[lVar16].cipher_suite = (ptls_cipher_suite_t *)0x0;
                  cVar15 = '\0';
                  iVar4 = (int)local_48;
                }
LAB_00110a62:
                local_58 = paVar18;
                iVar5 = 0x32;
                if (local_58 == paVar20) {
                  iVar5 = iVar4;
                }
                cVar3 = (local_58 != paVar20) * '\x05';
                if (cVar15 != '\0') {
                  iVar5 = iVar4;
                  cVar3 = cVar15;
                }
              }
            }
            if (cVar3 != '\x05') {
              if (cVar3 != '\0') {
                return iVar5;
              }
              iVar5 = 0x32;
              if (1 < (long)paVar13 - (long)local_58) {
                esni->padded_length =
                     *(ushort *)&local_58->cipher_suite << 8 |
                     *(ushort *)&local_58->cipher_suite >> 8;
                local_58 = (anon_struct_72_2_510fbff9 *)((long)&local_58->cipher_suite + 2);
                iVar5 = ptls_decode64(&esni->not_before,(uint8_t **)&local_58,(uint8_t *)paVar13);
                if ((iVar5 == 0) &&
                   (iVar5 = ptls_decode64(&esni->not_after,(uint8_t **)&local_58,(uint8_t *)paVar13)
                   , iVar5 == 0)) {
                  iVar14 = 0x32;
                  iVar4 = 5;
                  if (1 < (ulong)((long)paVar13 - (long)local_58)) {
                    lVar16 = 0;
                    uVar19 = 0;
                    do {
                      uVar19 = (ulong)local_58->record_digest[lVar16 + -8] | uVar19 << 8;
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 2);
                    local_58 = (anon_struct_72_2_510fbff9 *)((long)&local_58->cipher_suite + 2);
                    if (uVar19 <= (ulong)((long)paVar13 - (long)local_58)) {
                      paVar18 = (anon_struct_72_2_510fbff9 *)
                                (local_58->record_digest + (uVar19 - 8));
                      if (local_58 == paVar18) {
                        iVar4 = 0;
                        iVar14 = 0;
                      }
                      else {
                        do {
                          uVar19 = (ulong)((uint)(1 < (long)paVar18 - (long)local_58) * 2);
                          paVar20 = (anon_struct_72_2_510fbff9 *)
                                    (local_58->record_digest + (uVar19 - 8));
                          iVar4 = 5;
                          iVar14 = 0x32;
                          if ((long)paVar18 - (long)local_58 < 2) {
                            bVar2 = false;
                          }
                          else {
                            iVar14 = 0x32;
                            if ((ulong)((long)paVar18 - (long)paVar20) < 2) {
                              bVar2 = false;
                            }
                            else {
                              lVar16 = 0;
                              uVar17 = 0;
                              do {
                                uVar17 = (ulong)paVar20->record_digest[lVar16 + -8] | uVar17 << 8;
                                lVar16 = lVar16 + 1;
                              } while (lVar16 != 2);
                              bVar2 = false;
                              if ((ulong)((long)paVar18 -
                                         (long)(local_58->record_digest + (uVar19 - 6))) < uVar17) {
                                paVar20 = (anon_struct_72_2_510fbff9 *)
                                          (local_58->record_digest + (uVar19 - 6));
                              }
                              else {
                                paVar20 = (anon_struct_72_2_510fbff9 *)
                                          (local_58->record_digest + (uVar19 - 6) + uVar17);
                                bVar2 = true;
                                iVar4 = 0;
                                iVar14 = 0;
                              }
                            }
                          }
                          local_58 = paVar20;
                          if (!bVar2) goto LAB_00110c0a;
                        } while (paVar20 != paVar18);
                        iVar4 = 0;
                      }
                    }
                  }
LAB_00110c0a:
                  iVar5 = iVar14;
                  if (iVar4 != 5) {
                    if (iVar4 != 0) {
                      return iVar14;
                    }
                    iVar5 = 0x32;
                    local_4c = iVar14;
                    if (local_58 == paVar13) {
                      local_48 = esni->cipher_suites;
                      ppVar9 = local_48->cipher_suite;
                      if (ppVar9 == (ptls_cipher_suite_t *)0x0) {
                        iVar4 = 0;
                      }
                      else {
                        lVar16 = 0x48;
                        lVar7 = 0;
                        do {
                          ppVar10 = (*ppVar9->hash->create)();
                          if (ppVar10 == (ptls_hash_context_t *)0x0) {
                            local_4c = 0x201;
                            iVar4 = 5;
                            goto LAB_00110cc4;
                          }
                          local_48 = (anon_struct_72_2_510fbff9 *)local_48->record_digest;
                          (*ppVar10->update)(ppVar10,paVar12,sVar11);
                          local_4c = 0;
                          (*ppVar10->final)(ppVar10,local_48,PTLS_HASH_FINAL_MODE_FREE);
                          lVar7 = lVar7 + 1;
                          local_48 = esni->cipher_suites + lVar7;
                          ppVar9 = *(ptls_cipher_suite_t **)
                                    (esni->cipher_suites->record_digest + lVar16 + -8);
                          lVar16 = lVar16 + 0x48;
                        } while (ppVar9 != (ptls_cipher_suite_t *)0x0);
                        iVar4 = 0;
                        local_4c = 0;
                      }
LAB_00110cc4:
                      iVar5 = local_4c;
                      if (iVar4 != 5) {
                        if (iVar4 != 0) {
                          return local_4c;
                        }
                        iVar5 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (iVar5 != 0) {
    ptls_esni_dispose_context(esni);
  }
  return iVar5;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if ((ret = ptls_decode16(&esni->version, &src, end)) != 0)
        goto Exit;
    /* Skip checksum fields */
    if (end - src < 4) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 4;
    /* Published SNI field */
    ptls_decode_open_block(src, end, 2, { src = end; });

    /* Process the list of KeyShareEntries, verify for each of them that the ciphersuite is supported. */
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    /* Process the list of cipher_suites. If they are supported, store in esni context  */
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    /* Parse the padded length, not before, not after parameters */
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    /* Skip the extension fields */
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}